

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeF64
          (BinaryReaderObjdumpDisassemble *this,uint64_t value)

{
  char local_48 [8];
  char buffer [40];
  uint64_t value_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  buffer._32_8_ = value;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    WriteDoubleHex(local_48,0x28,value);
    LogOpcode(this,local_48);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeF64(uint64_t value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  char buffer[WABT_MAX_DOUBLE_HEX];
  WriteDoubleHex(buffer, sizeof(buffer), value);
  LogOpcode(buffer);
  return Result::Ok;
}